

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_iq4_nl_impl
               (int super_block_size,int block_size,float *x,ggml_fp16_t *dh,uint8_t *q4,
               uint16_t *scales_h,uint8_t *scales_l,float *scales,float *weight,uint8_t *L,
               int8_t *values,float *quant_weights,int ntry)

{
  uint8_t *puVar1;
  byte *pbVar2;
  float fVar3;
  float fVar4;
  ggml_fp16_t gVar5;
  int j_1;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  int ib;
  long lVar11;
  undefined4 in_register_00000034;
  int8_t *val;
  ggml_fp16_t *pgVar12;
  int j;
  uint uVar13;
  long lVar14;
  float *pfVar15;
  int j_4;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long local_f8;
  float *local_90;
  float local_88;
  float local_58;
  float local_48;
  
  local_f8 = CONCAT44(in_register_00000034,block_size);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < super_block_size) {
    uVar9 = (ulong)(uint)super_block_size;
  }
  fVar16 = 0.0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    fVar3 = *(float *)(local_f8 + uVar8 * 4);
    fVar16 = fVar16 + fVar3 * fVar3;
  }
  val = (int8_t *)0x0;
  pgVar12 = dh;
  memset(dh,0,(ulong)((uint)super_block_size >> 1));
  uVar8 = (ulong)((uint)super_block_size >> 5);
  fVar3 = *(float *)(&DAT_0014f6f4 + (ulong)(0 < (int)values) * 4);
  local_90 = weight;
  fVar4 = 0.0;
  fVar19 = 0.0;
  puVar10 = L;
  lVar11 = local_f8;
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    if (L == (uint8_t *)0x0) {
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
        fVar18 = *(float *)(lVar11 + lVar14 * 4);
        scales[lVar14] = fVar18 * fVar18;
      }
    }
    else {
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
        fVar18 = *(float *)(puVar10 + lVar14 * 4);
        fVar17 = *(float *)(lVar11 + lVar14 * 4);
        fVar17 = fVar17 * fVar17 + (2.0 / (float)super_block_size) * fVar16;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        scales[lVar14] = fVar18 * fVar17;
      }
    }
    fVar18 = 0.0;
    local_88 = 0.0;
    for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
      fVar17 = *(float *)(lVar11 + lVar14 * 4);
      fVar21 = ABS(fVar17);
      local_88 = (float)(~-(uint)(fVar18 < fVar21) & (uint)local_88 |
                        (uint)fVar17 & -(uint)(fVar18 < fVar21));
      if (fVar21 <= fVar18) {
        fVar21 = fVar18;
      }
      fVar18 = fVar21;
    }
    if (1e-15 <= fVar18) {
      local_58 = 0.0;
      local_48 = 0.0;
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
        fVar18 = *(float *)(lVar11 + lVar14 * 4);
        iVar6 = best_index_int8((int)pgVar12,val,(1.0 / (local_88 / fVar3)) * fVar18);
        *(char *)((long)local_90 + lVar14) = (char)iVar6;
        fVar17 = scales[lVar14] * (float)(int)kvalues_iq4nl[iVar6];
        local_58 = local_58 + (float)(int)kvalues_iq4nl[iVar6] * fVar17;
        local_48 = local_48 + fVar18 * fVar17;
      }
      local_58 = local_48 / local_58;
      local_48 = local_48 * local_58;
      for (iVar6 = -(int)values; iVar6 <= (int)values; iVar6 = iVar6 + 1) {
        fVar18 = 0.0;
        fVar17 = 0.0;
        for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
          fVar21 = *(float *)(lVar11 + lVar14 * 4);
          iVar7 = best_index_int8((int)pgVar12,val,((float)(iVar6 + -0x7f) / local_88) * fVar21);
          fVar20 = scales[lVar14] * (float)(int)kvalues_iq4nl[iVar7];
          fVar18 = fVar18 + (float)(int)kvalues_iq4nl[iVar7] * fVar20;
          fVar17 = fVar17 + fVar21 * fVar20;
        }
        if (0.0 < fVar18) {
          if (local_48 * fVar18 < fVar17 * fVar17) {
            local_58 = fVar17 / fVar18;
            local_48 = fVar17 * local_58;
          }
        }
      }
      *(float *)(scales_l + uVar9 * 4) = local_58;
      fVar17 = ABS(local_58);
      fVar18 = fVar17;
      if (fVar17 <= fVar4) {
        fVar18 = fVar4;
      }
      fVar19 = (float)(~-(uint)(fVar4 < fVar17) & (uint)fVar19 |
                      (uint)local_58 & -(uint)(fVar4 < fVar17));
      fVar4 = fVar18;
    }
    else {
      puVar1 = scales_l + uVar9 * 4;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    lVar11 = lVar11 + 0x80;
    puVar10 = puVar10 + 0x80;
    local_90 = local_90 + 8;
  }
  if ((uint)super_block_size < 0x40) {
    fVar16 = *(float *)scales_l;
    gVar5 = ggml_compute_fp32_to_fp16(fVar16);
    *(ggml_fp16_t *)x = gVar5;
    if (0 < (int)values) {
      for (uVar9 = 0; (uint)super_block_size != uVar9; uVar9 = uVar9 + 1) {
        iVar6 = best_index_int8((int)pgVar12,val,
                                *(float *)(local_f8 + uVar9 * 4) *
                                (float)(-(uint)(fVar16 != 0.0) & (uint)(1.0 / fVar16)));
        *(char *)((long)weight + uVar9) = (char)iVar6;
      }
    }
  }
  else {
    q4[0] = '\0';
    q4[1] = '\0';
    fVar19 = fVar19 * -0.03125;
    gVar5 = ggml_compute_fp32_to_fp16(fVar19);
    *(ggml_fp16_t *)x = gVar5;
    pfVar15 = weight;
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      uVar13 = (uint)(*(float *)(scales_l + uVar9 * 4) *
                      (float)(-(uint)(fVar19 != 0.0) & (uint)(1.0 / fVar19)) + 12582912.0) &
               0x7fffff;
      if (0x40001e < uVar13) {
        uVar13 = 0x40001f;
      }
      if (uVar13 < 0x3fffe1) {
        uVar13 = 0x3fffe0;
      }
      fVar16 = (float)(int)(uVar13 - 0x400000) * fVar19;
      for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
        iVar6 = best_index_int8((int)pgVar12,val,
                                *(float *)(local_f8 + lVar11 * 4) *
                                (float)(-(uint)(fVar16 != 0.0) & (uint)(1.0 / fVar16)));
        *(char *)((long)pfVar15 + lVar11) = (char)iVar6;
      }
      if ((uVar9 & 1) == 0) {
        *(byte *)((long)scales_h + (uVar9 >> 1 & 0x7fffffff)) = (byte)uVar13 & 0xf;
      }
      else {
        pbVar2 = (byte *)((long)scales_h + (uVar9 >> 1 & 0x7fffffff));
        *pbVar2 = *pbVar2 | (byte)uVar13 << 4;
      }
      *(ushort *)(q4 + (uVar9 >> 3 & 0x1fffffff) * 2) =
           *(ushort *)(q4 + (uVar9 >> 3 & 0x1fffffff) * 2) |
           (ushort)((uVar13 + 0x20 >> 4 & 0xff) << ((char)uVar9 * '\x02' & 0xeU));
      pfVar15 = pfVar15 + 8;
      local_f8 = local_f8 + 0x80;
    }
  }
  pfVar15 = weight + 4;
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      *(byte *)((long)dh + lVar11) =
           *(char *)((long)pfVar15 + lVar11) << 4 | *(byte *)((long)pfVar15 + lVar11 + -0x10);
    }
    dh = dh + 8;
    pfVar15 = pfVar15 + 8;
  }
  return;
}

Assistant:

static void quantize_row_iq4_nl_impl(const int super_block_size, const int block_size, const float * GGML_RESTRICT x,
        ggml_fp16_t * dh, uint8_t * q4, uint16_t * scales_h, uint8_t * scales_l,
        float * scales, float * weight, uint8_t * L,
        const int8_t * values,
        const float * quant_weights,
        const int ntry) {

    float sigma2 = 0;
    for (int j = 0; j < super_block_size; ++j) sigma2 += x[j]*x[j];
    sigma2 *= 2.f/super_block_size;

    memset(q4, 0, super_block_size/2);
    dh[0] = GGML_FP32_TO_FP16(0.f);

    float max_scale = 0, amax_scale = 0;
    for (int ib = 0; ib < super_block_size/block_size; ++ib) {
        const float * xb = x + ib*block_size;
        uint8_t * Lb = L + ib*block_size;
        if (quant_weights) {
            const float * qw = quant_weights + ib*block_size;
            for (int j = 0; j < block_size; ++j) weight[j] = qw[j] * sqrtf(sigma2 + xb[j]*xb[j]);
        } else {
            for (int j = 0; j < block_size; ++j) weight[j] = xb[j]*xb[j];
        }
        float amax = 0, max = 0;
        for (int j = 0; j < block_size; ++j) {
            float ax = fabsf(xb[j]);
            if (ax > amax) {
                amax = ax; max = xb[j];
            }
        }
        if (amax < GROUP_MAX_EPS) {
            scales[ib] = 0;
            continue;
        }
        float d = ntry > 0 ? -max/values[0] : max/values[0];
        float id = 1/d;
        float sumqx = 0, sumq2 = 0;
        for (int j = 0; j < block_size; ++j) {
            float al = id*xb[j];
            int l = best_index_int8(16, values, al);
            Lb[j] = l;
            float q = values[l];
            float w = weight[j];
            sumqx += w*q*xb[j];
            sumq2 += w*q*q;
        }
        d = sumqx/sumq2;
        float best = d*sumqx;
        for (int itry = -ntry; itry <= ntry; ++itry) {
            id = (itry + values[0])/max;
            sumqx = sumq2 = 0;
            for (int j = 0; j < block_size; ++j) {
                float al = id*xb[j];
                int l = best_index_int8(16, values, al);
                float q = values[l];
                float w = weight[j];
                sumqx += w*q*xb[j];
                sumq2 += w*q*q;
            }
            if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                d = sumqx/sumq2; best = d * sumqx;
            }
        }
        scales[ib] = d;
        float abs_d = fabsf(d);
        if (abs_d > amax_scale) {
            amax_scale = abs_d; max_scale = d;
        }
    }

    if (super_block_size/block_size > 1) {
        int nb = super_block_size/block_size;
        memset(scales_h, 0, ((nb+7)/8)*sizeof(uint16_t));
        float d = -max_scale/32;
        dh[0] = GGML_FP32_TO_FP16(d);
        float id = d ? 1/d : 0.f;
        for (int ib = 0; ib < super_block_size/block_size; ++ib) {
            int l = nearest_int(id*scales[ib]);
            l = MAX(-32, MIN(31, l));
            float dl = d * l;
            float idl = dl ? 1/dl : 0.f;
            uint8_t * Lb = L + ib*block_size;
            const float * xb = x + ib*block_size;
            for (int j = 0; j < block_size; ++j) {
                Lb[j] = best_index_int8(16, values, idl*xb[j]);
            }
            l += 32;
            uint8_t l_l = l & 0xf;
            uint8_t l_h = l >>  4;
            if (ib%2 == 0) scales_l[ib/2] = l_l;
            else scales_l[ib/2] |= (l_l << 4);
            scales_h[ib/8] |= (l_h << 2*(ib%8));
        }
    } else {
        dh[0] = GGML_FP32_TO_FP16(scales[0]);
        if (ntry > 0) {
            float id = scales[0] ? 1/scales[0] : 0;
            for (int j = 0; j < super_block_size; ++j) {
                L[j] = best_index_int8(16, values, id*x[j]);
            }
        }
    }

    for (int i = 0; i < super_block_size/32; ++i) {
        for (int j = 0; j < 16; ++j) {
            q4[16*i + j] = L[32*i + j] | (L[32*i + 16 + j] << 4);
        }
    }
}